

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::init
          (SamplerBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer puVar2;
  RenderContext *pRVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer puVar7;
  undefined4 extraout_var_00;
  long lVar8;
  Vec4 *color;
  long lVar9;
  TextureLevel level;
  Random rnd;
  allocator_type local_b1;
  long local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [8];
  pointer puStack_90;
  pointer local_88;
  ConstPixelBufferAccess local_68;
  deRandom local_40;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  iVar4 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_b0 = CONCAT44(extraout_var,iVar4);
  dVar5 = deStringHash((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar5 ^ 0xff23a4);
  local_68.m_format = (TextureFormat)((ulong)local_68.m_format.type << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,
             (long)(this->super_LayoutBindingRenderCase).m_numBindings,
             (value_type_conflict4 *)&local_68,&local_b1);
  puVar7 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_90;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_88;
  local_98._0_4_ = R;
  local_98._4_4_ = SNORM_INT8;
  puStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)puVar2 - (long)puVar7);
    if ((TextureFormat)local_98 != (TextureFormat)0x0) {
      operator_delete((void *)local_98,(long)local_88 - (long)local_98);
    }
  }
  if (0 < (int)((ulong)((long)(this->m_textures).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_textures).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    iVar4 = 0;
    do {
      getRandomColor((anon_unknown_1 *)local_98,(Random *)&local_40);
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &this->m_textureColors,(Vector<float,_4> *)local_98);
      iVar4 = iVar4 + 1;
    } while (iVar4 < (int)((ulong)((long)(this->m_textures).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_textures).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  (**(code **)(local_b0 + 0x6f8))();
  puVar7 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_textures).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2)) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      uVar1 = puVar7[lVar9];
      color = (Vec4 *)((long)((this->m_textureColors).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8);
      iVar4 = (this->super_LayoutBindingRenderCase).m_bindings.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar9];
      local_a8 = lVar8;
      iVar6 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar8 = CONCAT44(extraout_var_00,iVar6);
      (**(code **)(lVar8 + 8))(iVar4 + 0x84c0);
      (**(code **)(lVar8 + 0xb8))(this->m_textureType,uVar1);
      local_a0 = lVar8;
      (**(code **)(lVar8 + 0x1360))(this->m_textureType,0x2801,0x2601);
      if (this->m_textureType == 0x806f) {
        local_68.m_format.order = RGBA;
        local_68.m_format.type = UNORM_INT8;
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_98,&local_68.m_format,1,1,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_98);
        tcu::clear((PixelBufferAccess *)&local_68,color);
        pRVar3 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
        dVar5 = this->m_textureType;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_98);
        glu::texImage3D(pRVar3,dVar5,0,0x8058,&local_68);
LAB_01448d30:
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_98);
      }
      else if (this->m_textureType == 0xde1) {
        local_68.m_format.order = RGBA;
        local_68.m_format.type = UNORM_INT8;
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_98,&local_68.m_format,1,1,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_98);
        tcu::clear((PixelBufferAccess *)&local_68,color);
        pRVar3 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
        dVar5 = this->m_textureType;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_68,(TextureLevel *)local_98);
        glu::texImage2D(pRVar3,dVar5,0,0x8058,&local_68);
        goto LAB_01448d30;
      }
      dVar5 = (**(code **)(local_a0 + 0x800))();
      glu::checkError(dVar5,"Texture initialization failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                      ,0x4a2);
      lVar9 = lVar9 + 1;
      puVar7 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = local_a8 + 0x10;
    } while (lVar9 < (int)((ulong)((long)(this->m_textures).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7)
                          >> 2));
  }
  iVar4 = (**(code **)(local_b0 + 8))(0x84c0);
  return iVar4;
}

Assistant:

void SamplerBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);


	// Initialize texture resources
	m_textures = std::vector<glw::GLuint>(m_numBindings,  0);

	// Texture colors
	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		m_textureColors.push_back(getRandomColor(rnd));

	// Textures
	gl.genTextures((glw::GLsizei)m_textures.size(), &m_textures[0]);

	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		initializeTexture(m_bindings[texNdx], m_textures[texNdx], m_textureColors[texNdx]);

	gl.activeTexture(GL_TEXTURE0);
}